

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O1

void convolve(int *c1,int *c2,int param_3)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  void *__ptr;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  float fVar13;
  float in_stack_000004f8;
  uint in_stack_000004fc;
  float in_stack_000009f0;
  uint in_stack_000009f4;
  long local_68;
  long local_60;
  
  iVar2 = (int)in_stack_000009f4 / 2;
  param_3 = param_3 - iVar2;
  if (iVar2 < param_3) {
    iVar6 = c1[2];
    iVar10 = 0;
    local_60 = (long)iVar2;
    do {
      if (0 < iVar6) {
        uVar1 = c1[1];
        iVar5 = 0;
        do {
          if (0 < (int)uVar1) {
            lVar3 = *(long *)(c2 + (local_60 - iVar2) * 2 + 6);
            iVar7 = *c2;
            uVar9 = 0;
            do {
              if ((int)in_stack_000009f4 < 1) {
                fVar13 = 0.0;
              }
              else {
                fVar13 = 0.0;
                uVar12 = 0;
                do {
                  fVar13 = fVar13 + *(float *)(*(long *)(c1 + (long)(iVar10 + (int)uVar12) * 2 + 6)
                                              + ((long)*c1 * (long)iVar5 + uVar9) * 4) *
                                    *(float *)(&stack0x00000500 + uVar12 * 4);
                  uVar12 = uVar12 + 1;
                } while (in_stack_000009f4 != uVar12);
              }
              *(float *)(lVar3 + (uVar9 + (long)iVar7 * (long)iVar5) * 4) =
                   fVar13 / in_stack_000009f0;
              uVar9 = uVar9 + 1;
            } while (uVar9 != uVar1);
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 != iVar6);
      }
      local_60 = local_60 + 1;
      iVar10 = iVar10 + 1;
    } while (local_60 != param_3);
  }
  iVar6 = (int)in_stack_000004fc / 2;
  if (iVar2 < param_3) {
    iVar10 = c2[2];
    lVar3 = (long)iVar2;
    local_68 = lVar3;
    do {
      __ptr = malloc(0x61840);
      if (0 < iVar10) {
        lVar4 = (long)c2[1] - (long)iVar6;
        iVar2 = 0;
        do {
          if (iVar6 < (int)lVar4) {
            iVar5 = *c2;
            iVar7 = 0;
            lVar8 = (long)iVar6;
            do {
              if ((int)in_stack_000004fc < 1) {
                fVar13 = 0.0;
              }
              else {
                fVar13 = 0.0;
                uVar9 = 0;
                do {
                  fVar13 = fVar13 + *(float *)(*(long *)(c2 + (local_68 - lVar3) * 2 + 6) +
                                              (long)(*c2 * iVar2 + iVar7 + (int)uVar9) * 4) *
                                    *(float *)(&stack0x00000008 + uVar9 * 4);
                  uVar9 = uVar9 + 1;
                } while (in_stack_000004fc != uVar9);
              }
              *(float *)((long)__ptr + (lVar8 + (long)iVar2 * (long)iVar5) * 4) =
                   fVar13 / in_stack_000004f8;
              lVar8 = lVar8 + 1;
              iVar7 = iVar7 + 1;
            } while (lVar8 != lVar4);
          }
          iVar2 = iVar2 + 1;
        } while (iVar2 != iVar10);
      }
      if (iVar6 < iVar10 - iVar6) {
        uVar1 = c2[1];
        iVar5 = 0;
        iVar2 = iVar6;
        do {
          if (0 < (int)uVar1) {
            lVar4 = *(long *)(c2 + (local_68 - lVar3) * 2 + 6);
            iVar7 = *c2;
            uVar9 = 0;
            do {
              if ((int)in_stack_000004fc < 1) {
                fVar13 = 0.0;
              }
              else {
                iVar11 = iVar5 * *c2;
                fVar13 = 0.0;
                uVar12 = 0;
                do {
                  fVar13 = fVar13 + *(float *)((long)__ptr + (uVar9 + (long)iVar11) * 4) *
                                    *(float *)(&stack0x00000008 + uVar12 * 4);
                  uVar12 = uVar12 + 1;
                  iVar11 = iVar11 + *c2;
                } while (in_stack_000004fc != uVar12);
              }
              *(float *)(lVar4 + (uVar9 + (long)iVar2 * (long)iVar7) * 4) =
                   fVar13 / in_stack_000004f8;
              uVar9 = uVar9 + 1;
            } while (uVar9 != uVar1);
          }
          iVar2 = iVar2 + 1;
          iVar5 = iVar5 + 1;
        } while (iVar2 != iVar10 - iVar6);
      }
      free(__ptr);
      local_68 = local_68 + 1;
    } while (local_68 != param_3);
  }
  c2[4] = c2[4] + iVar6;
  return;
}

Assistant:

void convolve(c1,c2,ker1,ker2,n)
qnode_ptr_t c1, c2 ;
kernel_t ker1, ker2 ;
int n ;

{ image512_t *t ;
  float s ;
  int i, j, k, l, h1, h2 ;

  h2 = ker2.m/2 ;

  for (k = h2 ; k < n - h2 ; k++) {
    for (i = 0 ; i < c1->sizy ; i++) {
      for (j = 0 ; j < c1->sizx ; j++) {
        s = 0.0 ;
        for (l = 0 ; l < ker2.m ; l++) {
          s += (*c1->gauss_ptr[l+k-h2])[c1->res*i + j]*ker2.k[l] ;
        }
        (*c2->gauss_ptr[k-h2])[c2->res*i + j] = s/ker2.f ;
      }
    }
  }

  h1 = ker1.m/2 ;

  for (k = h2 ; k < n - h2 ; k++) {

    t = (image512_t *)malloc(sizeof(image512_t)) ;

    for (i = 0 ; i < c2->sizy ; i++) {
      for (j = h1 ; j < c2->sizx - h1 ; j++) {
        s = 0.0 ;
        for (l = 0 ; l < ker1.m ; l++) {
          s += (*c2->gauss_ptr[k-h2])[c2->res*i + j+l-h1]*ker1.k[l] ;
        }
        (*t)[c2->res*i + j] = s/ker1.f ;
      }
    }

    for (i = h1 ; i < c2->sizy - h1 ; i++) {
      for (j = 0 ; j < c2->sizx ; j++) {
        s = 0.0 ;
        for (l = 0 ; l < ker1.m ; l++) {
          s += (*t)[c2->res*(i+l-h1) + j]*ker1.k[l] ;
        }
        (*c2->gauss_ptr[k-h2])[c2->res*i + j] = s/ker1.f ;
      }
    }
    free((image512_t *)t) ;
  }
  c2->ofst += h1 ;
}